

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportBuildFileGenerator::InstallNameDir
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *target
          ,string *config)

{
  bool bVar1;
  cmMakefile *this_00;
  string local_90;
  allocator<char> local_69;
  string local_68;
  cmMakefile *local_38;
  cmMakefile *mf;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmExportBuildFileGenerator *this_local;
  string *install_name_dir;
  
  mf._7_1_ = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmExportBuildFileGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = cmTarget::GetMakefile(*(cmTarget **)config_local);
  local_38 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_69);
  bVar1 = cmMakefile::IsOn(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar1) {
    cmGeneratorTarget::GetInstallNameDirForBuildTree
              (&local_90,(cmGeneratorTarget *)config_local,local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportBuildFileGenerator::InstallNameDir(
  cmGeneratorTarget* target, const std::string& config)
{
  std::string install_name_dir;

  cmMakefile* mf = target->Target->GetMakefile();
  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    install_name_dir = target->GetInstallNameDirForBuildTree(config);
  }

  return install_name_dir;
}